

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void reset_visuals(_Bool load_prefs)

{
  feature *pfVar1;
  monster_race *pmVar2;
  object_kind *poVar3;
  trap_kind_conflict *ptVar4;
  char local_828 [8];
  char buf [2014];
  graphics_mode *mode;
  trap_kind *trap;
  monster_race *race;
  object_kind *kind;
  feature *feat;
  flavor *f;
  int local_10;
  wchar_t j;
  wchar_t i;
  _Bool load_prefs_local;
  
  for (local_10 = 0; pfVar1 = f_info, local_10 < (int)(uint)z_info->f_max; local_10 = local_10 + 1)
  {
    for (f._4_4_ = 0; f._4_4_ < 4; f._4_4_ = f._4_4_ + 1) {
      feat_x_attr[f._4_4_][local_10] = pfVar1[local_10].d_attr;
      feat_x_char[f._4_4_][local_10] = pfVar1[local_10].d_char;
    }
  }
  for (local_10 = 0; poVar3 = k_info, local_10 < (int)(uint)z_info->k_max; local_10 = local_10 + 1)
  {
    kind_x_attr[local_10] = k_info[local_10].d_attr;
    kind_x_char[local_10] = poVar3[local_10].d_char;
  }
  for (local_10 = 0; pmVar2 = r_info, local_10 < (int)(uint)z_info->r_max; local_10 = local_10 + 1)
  {
    monster_x_attr[local_10] = r_info[local_10].d_attr;
    monster_x_char[local_10] = pmVar2[local_10].d_char;
  }
  for (local_10 = 0; ptVar4 = trap_info, local_10 < (int)(uint)z_info->trap_max;
      local_10 = local_10 + 1) {
    for (f._4_4_ = 0; f._4_4_ < 4; f._4_4_ = f._4_4_ + 1) {
      trap_x_attr[f._4_4_][local_10] = ptVar4[local_10].d_attr;
      trap_x_char[f._4_4_][local_10] = ptVar4[local_10].d_char;
    }
  }
  for (feat = (feature *)flavors; feat != (feature *)0x0; feat = (feature *)feat->desc) {
    flavor_x_attr[(uint)feat->fidx] = feat->field_0x16;
    flavor_x_char[(uint)feat->fidx] = *(wchar_t *)&feat->next;
  }
  if (load_prefs) {
    if (use_graphics == L'\0') {
      process_pref_file("font.prf",false,false);
    }
    else {
      register0x00000000 = get_graphics_mode((uint8_t)use_graphics);
      if (register0x00000000 == (graphics_mode *)0x0) {
        __assert_fail("mode",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                      ,0x574,"void reset_visuals(_Bool)");
      }
      path_build(local_828,0x7de,register0x00000000->path,register0x00000000->pref);
      process_pref_file_named(local_828,false,false);
    }
  }
  return;
}

Assistant:

void reset_visuals(bool load_prefs)
{
	int i, j;
	struct flavor *f;

	/* Extract default attr/char code for features */
	for (i = 0; i < z_info->f_max; i++) {
		struct feature *feat = &f_info[i];

		/* Assume we will use the underlying values */
		for (j = 0; j < LIGHTING_MAX; j++) {
			feat_x_attr[j][i] = feat->d_attr;
			feat_x_char[j][i] = feat->d_char;
		}
	}

	/* Extract default attr/char code for objects */
	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		/* Default attr/char */
		kind_x_attr[i] = kind->d_attr;
		kind_x_char[i] = kind->d_char;
	}

	/* Extract default attr/char code for monsters */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];

		/* Default attr/char */
		monster_x_attr[i] = race->d_attr;
		monster_x_char[i] = race->d_char;
	}

	/* Extract default attr/char code for traps */
	for (i = 0; i < z_info->trap_max; i++) {
		struct trap_kind *trap = &trap_info[i];

		/* Default attr/char */
		for (j = 0; j < LIGHTING_MAX; j++) {
			trap_x_attr[j][i] = trap->d_attr;
			trap_x_char[j][i] = trap->d_char;
		}
	}

	/* Extract default attr/char code for flavors */
	for (f = flavors; f; f = f->next) {
		flavor_x_attr[f->fidx] = f->d_attr;
		flavor_x_char[f->fidx] = f->d_char;
	}

	if (!load_prefs)
		return;

	/* Graphic symbols */
	if (use_graphics) {
		/* if we have a graphics mode, see if the mode has a pref file name */
		graphics_mode *mode = get_graphics_mode(use_graphics);
		char buf[2014];

		assert(mode);

		/* Build path to the pref file */
		path_build(buf, sizeof buf, mode->path, mode->pref);

		process_pref_file_named(buf, false, false);
	} else {
		/* Normal symbols */
		process_pref_file("font.prf", false, false);
	}
}